

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void alterneigh(nn_quant *nnq,int rad,int i,int al,int b,int g,int r)

{
  int iVar1;
  int *piVar2;
  nq_pixel *paiVar3;
  int *piVar4;
  int *local_48;
  int *q;
  int *p;
  int a;
  int hi;
  int lo;
  int k;
  int j;
  int g_local;
  int b_local;
  int al_local;
  int i_local;
  int rad_local;
  nn_quant *nnq_local;
  
  a = i - rad;
  if (a < -1) {
    a = -1;
  }
  p._4_4_ = i + rad;
  if (nnq->netsize < p._4_4_) {
    p._4_4_ = nnq->netsize;
  }
  lo = i + 1;
  hi = i + -1;
  local_48 = nnq->radpower;
  while (lo < p._4_4_ || a < hi) {
    piVar4 = local_48 + 1;
    iVar1 = local_48[1];
    if (lo < p._4_4_) {
      paiVar3 = nnq->network + lo;
      (*paiVar3)[0] = (*paiVar3)[0] - (iVar1 * ((*paiVar3)[0] - al)) / 0x40000;
      piVar2 = *paiVar3 + 1;
      *piVar2 = *piVar2 - (iVar1 * (*piVar2 - b)) / 0x40000;
      piVar2 = *paiVar3 + 2;
      *piVar2 = *piVar2 - (iVar1 * (*piVar2 - g)) / 0x40000;
      piVar2 = *paiVar3 + 3;
      *piVar2 = *piVar2 - (iVar1 * (*piVar2 - r)) / 0x40000;
      lo = lo + 1;
    }
    local_48 = piVar4;
    if (a < hi) {
      paiVar3 = nnq->network + hi;
      (*paiVar3)[0] = (*paiVar3)[0] - (iVar1 * ((*paiVar3)[0] - al)) / 0x40000;
      piVar4 = *paiVar3 + 1;
      *piVar4 = *piVar4 - (iVar1 * (*piVar4 - b)) / 0x40000;
      piVar4 = *paiVar3 + 2;
      *piVar4 = *piVar4 - (iVar1 * (*piVar4 - g)) / 0x40000;
      piVar4 = *paiVar3 + 3;
      *piVar4 = *piVar4 - (iVar1 * (*piVar4 - r)) / 0x40000;
      hi = hi + -1;
    }
  }
  return;
}

Assistant:

void alterneigh(nnq, rad,i,al,b,g,r)
nn_quant *nnq;
int rad,i;
register int al,b,g,r;
{
	register int j,k,lo,hi,a;
	register int *p, *q;

	lo = i-rad;
	if (lo<-1) lo=-1;
	hi = i+rad;
	if (hi>nnq->netsize) hi=nnq->netsize;

	j = i+1;
	k = i-1;
	q = nnq->radpower;
	while ((j<hi) || (k>lo)) {
		a = (*(++q));
		if (j<hi) {
			p = nnq->network[j];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			j++;
		}
		if (k>lo) {
			p = nnq->network[k];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			k--;
		}
	}
}